

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

QList<QByteArray> * __thiscall
QMetaMethodBuilder::parameterTypes
          (QList<QByteArray> *__return_storage_ptr__,QMetaMethodBuilder *this)

{
  QMetaMethodBuilderPrivate *this_00;
  
  this_00 = d_func(this);
  if (this_00 == (QMetaMethodBuilderPrivate *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QByteArray *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QMetaMethodBuilderPrivate::parameterTypes(__return_storage_ptr__,this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QByteArray> QMetaMethodBuilder::parameterTypes() const
{
    QMetaMethodBuilderPrivate *d = d_func();
    if (d)
        return d->parameterTypes();
    else
        return QList<QByteArray>();
}